

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.c
# Opt level: O2

int mp_fprint_ext_default(FILE *file,char **data,int depth)

{
  int iVar1;
  ulong in_RAX;
  undefined8 local_28;
  uint32_t len;
  int8_t type;
  
  local_28 = in_RAX;
  mp_decode_ext(data,(int8_t *)((long)&local_28 + 7),(uint32_t *)&local_28);
  iVar1 = fprintf((FILE *)file,"(extension: type %d, len %u)",(ulong)(uint)(int)local_28._7_1_,
                  local_28 & 0xffffffff);
  return iVar1;
}

Assistant:

int
mp_fprint_ext_default(FILE *file, const char **data, int depth)
{
	(void) depth;
	int8_t type;
	uint32_t len;
	mp_decode_ext(data, &type, &len);
	return fprintf(file, "(extension: type %d, len %u)", (int)type,
		      (unsigned)len);
}